

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::Path::evalImpl(Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path)

{
  ArrayDisposer *pAVar1;
  String *pSVar2;
  size_t sVar3;
  String *pSVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  unsigned_long i;
  char *pcVar8;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  
  pcVar5 = path.content.ptr;
  pcVar6 = pcVar5;
  if (((char *)0x1 < pcVar5) && (*(char *)&(parts->builder).ptr == '/')) {
    ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
  }
  pcVar7 = (char *)0x0;
  if (pcVar5 != (char *)0x1) {
    pcVar8 = (char *)0x0;
    do {
      if (pcVar8[(long)&parts->builder] == '/') {
        part.size_ = (size_t)pcVar6;
        part.ptr = pcVar8 + -(long)pcVar7;
        evalPart(this,(Vector<kj::String> *)(pcVar7 + (long)&parts->builder),part);
        pcVar7 = pcVar8 + 1;
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar5 + -1 != pcVar8);
  }
  part_00.ptr = pcVar5 + ~(ulong)pcVar7;
  part_00.size_ = (size_t)pcVar6;
  evalPart(this,(Vector<kj::String> *)(pcVar7 + (long)&parts->builder),part_00);
  pAVar1 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar1 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar1 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
  }
  pSVar2 = (this->parts).ptr;
  sVar3 = (this->parts).size_;
  pSVar4 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar2;
  (__return_storage_ptr__->parts).size_ = ((long)(sVar3 - (long)pSVar2) >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar4;
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalImpl(Vector<String>&& parts, StringPtr path) {
  if (path.startsWith("/")) {
    parts.clear();
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '/') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}